

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O3

Am_Object get_undo_handler(Am_Object *cmd)

{
  Am_Value *pAVar1;
  Am_Object *in_RSI;
  Am_Object panel;
  Am_Object local_20;
  Am_Object local_18;
  
  local_20.data = (Am_Object_Data *)0x0;
  cmd->data = (Am_Object_Data *)0x0;
  pAVar1 = Am_Object::Get(in_RSI,0x170,0);
  Am_Object::operator=(&local_20,pAVar1);
  Am_Object::Get_Object(&local_18,(Am_Slot_Key)&local_20,10);
  pAVar1 = Am_Object::Get(&local_18,Am_UNDO_HANDLER_TO_DISPLAY,0);
  Am_Object::operator=(cmd,pAVar1);
  Am_Object::~Am_Object(&local_18);
  Am_Object::~Am_Object(&local_20);
  return (Am_Object)(Am_Object_Data *)cmd;
}

Assistant:

Am_Object
get_undo_handler(Am_Object cmd)
{
  Am_Object panel, undo_handler;
  //Am_SAVED_OLD_OWNER of cmd is button_panel, owner is db
  panel = cmd.Get(Am_SAVED_OLD_OWNER);
  undo_handler = panel.Get_Owner().Get(Am_UNDO_HANDLER_TO_DISPLAY);
  return undo_handler;
}